

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O3

void tempseat_flush(Seat *seat)

{
  bufchain *ch;
  _func_void_Seat_ptr_size_t **pp_Var1;
  SeatVtable *ptr;
  size_t sVar2;
  _func_void_Seat_ptr_size_t *len;
  ptrlen pVar3;
  
  if (seat->vt != &tempseat_vt) {
    __assert_fail("seat->vt == &tempseat_vt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                  ,0x187,"void tempseat_flush(Seat *)");
  }
  ch = (bufchain *)(seat + -9);
  while( true ) {
    sVar2 = bufchain_size(ch);
    if (sVar2 == 0) break;
    pVar3 = bufchain_prefix(ch);
    ptr = seat[-4].vt;
    if (ptr == (SeatVtable *)0x0) {
      __assert_fail("ts->outchunk_head",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                    ,399,"void tempseat_flush(Seat *)");
    }
    len = ptr->sent;
    if ((_func_void_Seat_ptr_size_t *)pVar3.len < ptr->sent) {
      len = (_func_void_Seat_ptr_size_t *)pVar3.len;
    }
    (**(code **)(seat[-10].vt)->output)(seat[-10].vt,*(undefined4 *)&ptr->eof,pVar3.ptr,len);
    bufchain_consume(ch,(size_t)len);
    pp_Var1 = &ptr->sent;
    *pp_Var1 = *pp_Var1 + -(long)len;
    if (*pp_Var1 == (_func_void_Seat_ptr_size_t *)0x0) {
      seat[-4].vt = (SeatVtable *)ptr->output;
      safefree(ptr);
    }
  }
  if (seat[-4].vt != (SeatVtable *)0x0) {
    __assert_fail("!ts->outchunk_head",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                  ,0x19f,"void tempseat_flush(Seat *)");
  }
  if (*(char *)&seat[-2].vt == '\x01') {
    (**(code **)((seat[-10].vt)->output + 0x28))();
  }
  if (*(char *)((long)&seat[-2].vt + 1) == '\x01') {
    (**(code **)((seat[-10].vt)->output + 0x30))();
  }
  if (*(char *)((long)&seat[-2].vt + 2) == '\x01') {
    (**(code **)((seat[-10].vt)->output + 0x38))();
  }
  if (*(char *)((long)&seat[-2].vt + 3) == '\x01') {
    (**(code **)((seat[-10].vt)->output + 0x48))();
  }
  if (*(char *)((long)&seat[-2].vt + 4) == '\x01') {
    (**(code **)((seat[-10].vt)->output + 0x88))
              (seat[-10].vt,*(undefined1 *)((long)&seat[-2].vt + 5),
               *(undefined1 *)((long)&seat[-2].vt + 6));
  }
  if (*(char *)((long)&seat[-2].vt + 7) == '\x01') {
    (**(code **)((seat[-10].vt)->output + 0xb0))(seat[-10].vt,*(undefined1 *)&seat[-1].vt);
    return;
  }
  return;
}

Assistant:

void tempseat_flush(Seat *seat)
{
    assert(seat->vt == &tempseat_vt);
    TempSeat *ts = container_of(seat, TempSeat, seat);

    /* Empty the output bufchains into the real seat, taking care to
     * preserve both separation and interleaving */
    while (bufchain_size(&ts->output)) {
        ptrlen pl = bufchain_prefix(&ts->output);

        assert(ts->outchunk_head);
        struct output_chunk *chunk = ts->outchunk_head;

        if (pl.len > chunk->size)
            pl.len = chunk->size;

        seat_output(ts->realseat, chunk->type, pl.ptr, pl.len);
        bufchain_consume(&ts->output, pl.len);
        chunk->size -= pl.len;
        if (chunk->size == 0) {
            ts->outchunk_head = chunk->next;
            sfree(chunk);
        }
    }

    /* That should have exactly emptied the output chunk list too */
    assert(!ts->outchunk_head);

    /* Pass on any other kinds of event we've buffered */
    if (ts->seen_session_started)
        seat_notify_session_started(ts->realseat);
    if (ts->seen_remote_exit)
        seat_notify_remote_exit(ts->realseat);
    if (ts->seen_remote_disconnect)
        seat_notify_remote_disconnect(ts->realseat);
    if (ts->seen_update_specials_menu)
        seat_update_specials_menu(ts->realseat);
    if (ts->seen_echoedit_update)
        seat_echoedit_update(ts->realseat, ts->echoing, ts->editing);
    if (ts->seen_trust_status)
        seat_set_trust_status(ts->realseat, ts->trusted);
}